

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.tweetnacl.c
# Opt level: O1

void car25519(int64_t *o)

{
  long lVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  
  lVar3 = 0;
  do {
    uVar4 = o[lVar3] + 0x10000;
    o[lVar3] = uVar4;
    lVar1 = ((long)uVar4 >> 0x10) + -1;
    lVar5 = ((long)uVar4 >> 0x10) + lVar1 * 0x24 + -1;
    if (lVar3 != 0xf) {
      lVar5 = 0;
    }
    lVar2 = lVar3 + 1;
    lVar6 = lVar2;
    if (lVar3 == 0xf) {
      lVar6 = 0;
    }
    o[lVar6] = lVar1 + o[lVar6] + lVar5;
    o[lVar3] = o[lVar3] - (uVar4 & 0xffffffffffff0000);
    lVar3 = lVar2;
  } while (lVar2 != 0x10);
  return;
}

Assistant:

static void car25519(gf o)
{
  int64_t c;
  size_t i;

  for (i = 0; i < 16; i++)
  {
    o[i] += (1LL << 16);
    c = o[i] >> 16;
    o[(i + 1) * (i < 15)] += c - 1 + 37 * (c - 1) * (i == 15);
    o[i] -= c << 16;
  }
}